

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_sparse.c
# Opt level: O3

wchar_t archive_entry_sparse_next(archive_entry *entry,la_int64_t *offset,la_int64_t *length)

{
  ae_sparse *paVar1;
  wchar_t wVar2;
  la_int64_t lVar3;
  
  paVar1 = entry->sparse_p;
  if (paVar1 == (ae_sparse *)0x0) {
    *offset = 0;
    wVar2 = L'\xffffffec';
    lVar3 = 0;
  }
  else {
    *offset = paVar1->offset;
    lVar3 = paVar1->length;
    entry->sparse_p = paVar1->next;
    wVar2 = L'\0';
  }
  *length = lVar3;
  return wVar2;
}

Assistant:

int
archive_entry_sparse_next(struct archive_entry * entry,
	la_int64_t *offset, la_int64_t *length)
{
	if (entry->sparse_p) {
		*offset = entry->sparse_p->offset;
		*length = entry->sparse_p->length;

		entry->sparse_p = entry->sparse_p->next;

		return (ARCHIVE_OK);
	} else {
		*offset = 0;
		*length = 0;
		return (ARCHIVE_WARN);
	}
}